

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O1

void freecookie(Cookie *co)

{
  (*Curl_cfree)(co->domain);
  (*Curl_cfree)(co->path);
  (*Curl_cfree)(co->spath);
  (*Curl_cfree)(co->name);
  (*Curl_cfree)(co->value);
  (*Curl_cfree)(co);
  return;
}

Assistant:

static void freecookie(struct Cookie *co)
{
  free(co->domain);
  free(co->path);
  free(co->spath);
  free(co->name);
  free(co->value);
  free(co);
}